

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

CSVOption<bool> duckdb::CSVOption<bool>::Deserialize(Deserializer *deserializer)

{
  int iVar1;
  uint uVar2;
  ushort uVar3;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"set_by_user");
  if ((char)iVar1 == '\0') {
    uVar3 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    uVar3 = (ushort)iVar1 & 0xff;
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
  uVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return (CSVOption<bool>)(uVar3 | (ushort)((uVar2 & 0xff) << 8));
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}